

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O1

void __thiscall
despot::PlannerBase::InitializeLogger
          (PlannerBase *this,Logger **logger,Option *options,DSPOMDP *model,Belief *belief,
          Solver *solver,int num_runs,clock_t main_clock_start,World *world,string world_type,
          int time_limit,string solver_type)

{
  Logger *this_00;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_70;
  string local_50;
  
  this_00 = (Logger *)operator_new(0xb0);
  if ((int)world_type._M_string_length == -1) {
    paVar2 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,*(long *)world_type._M_dataplus._M_p,
               *(long *)(world_type._M_dataplus._M_p + 8) + *(long *)world_type._M_dataplus._M_p);
    Logger::Logger(this_00,model,belief,solver,world,&local_70,main_clock_start,
                   (ostream *)&std::cout,-1.0,-1);
    *logger = this_00;
    _Var1._M_p = local_70._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)world_type._M_dataplus._M_p,
               *(long *)(world_type._M_dataplus._M_p + 8) + *(long *)world_type._M_dataplus._M_p);
    Logger::Logger(this_00,model,belief,solver,world,&local_50,main_clock_start,
                   (ostream *)&std::cout,
                   (double)(int)world_type._M_string_length + EvalLog::curr_inst_start_time,
                   num_runs * DAT_00193dd8);
    *logger = this_00;
    _Var1._M_p = local_50._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p,paVar2->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PlannerBase::InitializeLogger(Logger *&logger,
		option::Option *options, DSPOMDP *model, Belief* belief, Solver *solver,
		int num_runs, clock_t main_clock_start, World* world, string world_type,
		int time_limit, string solver_type) {

	if (time_limit != -1) {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout,
				EvalLog::curr_inst_start_time + time_limit,
				num_runs * Globals::config.sim_len);
	} else {
		logger = new Logger(model, belief, solver, world, world_type,
				main_clock_start, &cout);
	}
}